

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_20.cpp
# Opt level: O1

ChStressTensor<double> * __thiscall
chrono::fea::ChElementHexaCorot_20::GetStress
          (ChStressTensor<double> *__return_storage_ptr__,ChElementHexaCorot_20 *this,double z1,
          double z2,double z3)

{
  element_type *peVar1;
  ChMatrixDynamic<> *local_58;
  ChStrainTensor<double> *local_50;
  ChStrainTensor<double> local_48;
  
  peVar1 = (this->Material).
           super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  GetStrain(&local_48,this,z1,z2,z3);
  if ((peVar1->StressStrainMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
      m_storage.m_cols == 6) {
    local_58 = &peVar1->StressStrainMatrix;
    local_50 = &local_48;
    ChVoightTensor<double>::
    ChVoightTensor<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,6,1,0,6,1>,0>>
              (&__return_storage_ptr__->super_ChVoightTensor<double>,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                *)&local_58);
    return __return_storage_ptr__;
  }
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, 6, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, 6, 1>, Option = 0]"
               );
}

Assistant:

ChStressTensor<> ChElementHexaCorot_20::GetStress(double z1, double z2, double z3) {
    ChStressTensor<> mstress = this->Material->Get_StressStrainMatrix() * this->GetStrain(z1, z2, z3);
    return mstress;
}